

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

pair<const_char_*,_unsigned_long> plot::utf8_clamp<char_const*>(char *first,char *last,size_t width)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  size_t request;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  
  uVar4 = width;
  if (first == last) {
LAB_00108e57:
    pVar10.second = width - uVar4;
    pVar10.first = first;
    return pVar10;
  }
LAB_00108cf0:
  bVar1 = *first;
  uVar7 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar6 = 2;
    if (((uVar7 & 0xffffffe0) != 0xc0) && (uVar6 = 3, (uVar7 & 0xfffffff0) != 0xe0)) {
      uVar9 = uVar7 & 0xfffffff8;
      uVar7 = 0xffffffff;
      uVar6 = 4;
      if (uVar9 != 0xf0) goto LAB_00108da2;
    }
    uVar7 = (uint)(*(byte *)((long)&detail::utf8_start_masks + (ulong)uVar6) & bVar1);
    if (1 < (int)(uVar6 - 1)) {
      do {
        uVar7 = uVar7 << 6;
        uVar6 = uVar6 - 1;
      } while (2 < uVar6);
    }
  }
LAB_00108da2:
  puVar5 = &detail::unicode_tables<void>::zero_width;
  do {
    pbVar3 = (byte *)first;
    if ((puVar5[1] <= uVar7) && (uVar2 = uVar4, uVar7 <= puVar5[2])) goto LAB_00108e06;
    puVar5 = *(uint **)(puVar5 + (ulong)(*puVar5 <= uVar7) * 2 + 4);
  } while (puVar5 != (uint *)0x0);
  puVar5 = &detail::unicode_tables<void>::double_width;
  do {
    if ((puVar5[1] <= uVar7) && (uVar7 <= puVar5[2])) {
      uVar8 = 2;
      goto LAB_00108dfb;
    }
    puVar5 = *(uint **)(puVar5 + (ulong)(*puVar5 <= uVar7) * 2 + 4);
  } while (puVar5 != (uint *)0x0);
  uVar8 = 1;
LAB_00108dfb:
  uVar2 = uVar4 - uVar8;
  if (uVar8 <= uVar4) {
LAB_00108e06:
    do {
      uVar4 = uVar2;
      first = last;
      if (pbVar3 == (byte *)last) goto LAB_00108e43;
      bVar1 = pbVar3[1];
      first = (char *)(pbVar3 + 1);
      if (((((bVar1 & 0xf8) == 0xf0) || ((bVar1 & 0xf0) == 0xe0)) || (-1 < (char)bVar1)) ||
         (pbVar3 = (byte *)first, uVar2 = uVar4, (bVar1 & 0xe0) == 0xc0)) goto LAB_00108e43;
    } while( true );
  }
  goto LAB_00108e57;
LAB_00108e43:
  if (first == last) goto LAB_00108e57;
  goto LAB_00108cf0;
}

Assistant:

std::pair<Iterator, std::size_t> utf8_clamp(Iterator first, Iterator last, std::size_t width) {
    std::size_t request = width;

    for (; first != last; first = detail::utf8_next(first, last)) {
        auto cw = detail::wcwidth(detail::utf8_cp(first, last));
        if (cw > width)
            break;
        width -= cw;
    }

    return { first, request - width };
}